

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::RGBFilm::AddSplat(RGBFilm *this,Point2f *p,SampledSpectrum L,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  float fVar2;
  Point2i p_00;
  bool bVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  ulong uVar5;
  Pixel *pPVar6;
  int iVar7;
  int iVar8;
  int i;
  long lVar9;
  Bounds2<int> *pBVar10;
  AtomicDouble *this_00;
  undefined1 auVar11 [16];
  float fVar12;
  Float FVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar18 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar23;
  initializer_list<float> __l;
  Bounds2iIterator BVar24;
  RGB RVar25;
  SampledSpectrum SVar26;
  float local_b8;
  Bounds2iIterator __begin1;
  undefined1 local_98 [16];
  Bounds2<int> local_88;
  undefined1 local_78 [16];
  Bounds2<int> *local_60;
  undefined8 local_58;
  SampledSpectrum H;
  SampledSpectrum L_local;
  
  local_88.pMax.super_Tuple2<pbrt::Point2,_int>.y = local_88.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  auVar21._8_56_ = L._16_56_;
  auVar21._0_8_ = L.values.values._8_8_;
  auVar15._8_56_ = L._8_56_;
  auVar15._0_8_ = L.values.values._0_8_;
  L_local.values.values = (array<float,_4>)vmovlhps_avx(auVar15._0_16_,auVar21._0_16_);
  bVar3 = SampledSpectrum::HasNaNs(&L_local);
  if (!bVar3) {
    auVar18 = (undefined1  [56])0x0;
    SVar26 = SampledSpectrum::operator*(&L_local,((this->super_FilmBase).sensor)->imagingRatio);
    auVar22._0_8_ = SVar26.values.values._8_8_;
    auVar22._8_56_ = auVar21._8_56_;
    auVar16._0_8_ = SVar26.values.values._0_8_;
    auVar16._8_56_ = auVar18;
    H.values.values = (array<float,_4>)vmovlhps_avx(auVar16._0_16_,auVar22._0_16_);
    auVar21._8_56_ = ZEXT856(H.values.values._8_8_);
    RVar25 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&H,lambda);
    local_b8 = RVar25.b;
    auVar17._0_8_ = RVar25._0_8_;
    auVar17._8_56_ = auVar21._8_56_;
    local_98 = auVar17._0_16_;
    uVar1 = vmovlps_avx(local_98);
    local_88.pMax.super_Tuple2<pbrt::Point2,_int>.x = (int)local_b8;
    local_88.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar1;
    local_88.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)((ulong)uVar1 >> 0x20);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_88;
    fVar12 = std::max<float>(__l);
    local_78 = vmovshdup_avx(local_98);
    if (this->maxComponentValue < fVar12) {
      SampledSpectrum::operator*=(&H,this->maxComponentValue / fVar12);
      local_98._0_4_ = RVar25.r;
      fVar12 = this->maxComponentValue / fVar12;
      local_98 = ZEXT416((uint)((float)local_98._0_4_ * fVar12));
      local_78 = ZEXT416((uint)((float)local_78._0_4_ * fVar12));
      local_b8 = local_b8 * fVar12;
    }
    fVar12 = (p->super_Tuple2<pbrt::Point2,_float>).x + 0.5;
    fVar2 = (p->super_Tuple2<pbrt::Point2,_float>).y + 0.5;
    uVar5 = *(ulong *)((this->super_FilmBase).filter.
                       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                       .bits & 0xffffffffffff);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar5;
    auVar11 = vmovshdup_avx(auVar11);
    fVar23 = (float)uVar5;
    auVar19 = ZEXT416((uint)(fVar12 - fVar23));
    auVar19 = vroundss_avx(auVar19,auVar19,9);
    auVar14 = ZEXT416((uint)(fVar2 - auVar11._0_4_));
    auVar14 = vroundss_avx(auVar14,auVar14,9);
    iVar7 = (int)auVar19._0_4_;
    auVar19 = ZEXT416((uint)(fVar12 + fVar23));
    auVar19 = vroundss_avx(auVar19,auVar19,9);
    auVar11 = ZEXT416((uint)(fVar2 + auVar11._0_4_));
    auVar11 = vroundss_avx(auVar11,auVar11,9);
    iVar8 = (int)auVar14._0_4_;
    local_88.pMax.super_Tuple2<pbrt::Point2,_int>.x = (int)auVar19._0_4_ + 1;
    local_88.pMax.super_Tuple2<pbrt::Point2,_int>.y = (int)auVar11._0_4_ + 1;
    local_88.pMin.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    if (local_88.pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar7) {
      local_88.pMin.super_Tuple2<pbrt::Point2,_int>.x =
           local_88.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    }
    local_88.pMin.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
    if (local_88.pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar8) {
      local_88.pMin.super_Tuple2<pbrt::Point2,_int>.y =
           local_88.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    }
    if (local_88.pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar7) {
      local_88.pMax.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    }
    if (local_88.pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar8) {
      local_88.pMax.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
    }
    local_88 = Intersect<int>(&local_88,&(this->super_FilmBase).pixelBounds);
    TVar4 = (Tuple2<pbrt::Point2,_int>)local_88.pMin.super_Tuple2<pbrt::Point2,_int>;
    __begin1.p.super_Tuple2<pbrt::Point2,_int> = TVar4;
    __begin1.bounds = &local_88;
    BVar24 = pbrt::end(&local_88);
    local_60 = BVar24.bounds;
    uVar5 = (ulong)TVar4 >> 0x20;
    pBVar10 = &local_88;
    while (((p_00.super_Tuple2<pbrt::Point2,_int> = __begin1.p.super_Tuple2<pbrt::Point2,_int>,
            TVar4.x != BVar24.p.super_Tuple2<pbrt::Point2,_int>.x ||
            ((int)uVar5 != BVar24.p.super_Tuple2<pbrt::Point2,_int>.y)) || (pBVar10 != local_60))) {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar14._8_8_ = 0;
      auVar14._0_4_ = __begin1.p.super_Tuple2<pbrt::Point2,_int>.x;
      auVar14._4_4_ = __begin1.p.super_Tuple2<pbrt::Point2,_int>.y;
      auVar11 = vcvtdq2ps_avx(auVar14);
      auVar11 = vsubps_avx(auVar20,auVar11);
      auVar19._8_4_ = 0xbf000000;
      auVar19._0_8_ = 0xbf000000bf000000;
      auVar19._12_4_ = 0xbf000000;
      auVar11 = vaddps_avx512vl(auVar11,auVar19);
      local_58 = vmovlps_avx(auVar11);
      FVar13 = TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
               ::
               Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                           *)&(this->super_FilmBase).filter,(Point2f *)&local_58);
      if ((FVar13 != 0.0) || (NAN(FVar13))) {
        pPVar6 = Array2D<pbrt::RGBFilm::Pixel>::operator[](&this->pixels,p_00);
        this_00 = pPVar6->splatRGB;
        lVar9 = 0;
        while( true ) {
          if (lVar9 == 3) break;
          fVar12 = (float)local_98._0_4_;
          if (((int)lVar9 != 0) && (fVar12 = (float)local_78._0_4_, (int)lVar9 != 1)) {
            fVar12 = local_b8;
          }
          AtomicDouble::Add(this_00,(double)(fVar12 * FVar13));
          lVar9 = lVar9 + 1;
          this_00 = this_00 + 1;
        }
      }
      Bounds2iIterator::operator++(&__begin1);
      TVar4 = __begin1.p.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
      uVar5 = (ulong)__begin1.p.super_Tuple2<pbrt::Point2,_int> >> 0x20;
      pBVar10 = __begin1.bounds;
    }
    return;
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,0x1ff,"Check failed: %s",(char (*) [13])"!L.HasNaNs()");
}

Assistant:

void RGBFilm::AddSplat(const Point2f &p, SampledSpectrum L,
                       const SampledWavelengths &lambda) {
    CHECK(!L.HasNaNs());
    // Convert sample radiance to _PixelSensor_ RGB
    SampledSpectrum H = L * sensor->ImagingRatio();
    RGB rgb = sensor->ToSensorRGB(H, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue) {
        H *= maxComponentValue / m;
        rgb *= maxComponentValue / m;
    }

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}